

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::UniformValueBooleanCase::test
          (UniformValueBooleanCase *this)

{
  CallLogWrapper *this_00;
  GLuint shader;
  GLuint shader_00;
  GLuint program;
  GLint GVar1;
  GLint GVar2;
  GLint in_R9D;
  GLint y;
  GLint in_stack_ffffffffffffffc0;
  
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  shader = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  shader_00 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
  y = 1;
  glu::CallLogWrapper::glShaderSource(this_00,shader,1,&test::testVertSource,(GLint *)0x0);
  GVar2 = 0;
  glu::CallLogWrapper::glShaderSource(this_00,shader_00,1,&test::testFragSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,shader);
  glu::CallLogWrapper::glCompileShader(this_00,shader_00);
  ApiCase::expectError(&this->super_ApiCase,0);
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  glu::CallLogWrapper::glAttachShader(this_00,program,shader);
  glu::CallLogWrapper::glAttachShader(this_00,program,shader_00);
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  ApiCase::expectError(&this->super_ApiCase,0);
  GVar1 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"boolUniform");
  glu::CallLogWrapper::glUniform1i(this_00,GVar1,1);
  verifyUniformValue1i
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             program,GVar1,GVar2);
  GVar1 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"bool2Uniform");
  glu::CallLogWrapper::glUniform2i(this_00,GVar1,1,2);
  verifyUniformValue2i
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             program,GVar1,1,in_R9D);
  GVar1 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"bool3Uniform");
  glu::CallLogWrapper::glUniform3i(this_00,GVar1,0,1,2);
  verifyUniformValue3i
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             program,GVar1,0,1,1);
  GVar1 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"bool4Uniform");
  glu::CallLogWrapper::glUniform4i(this_00,GVar1,1,0,1,-1);
  GVar2 = 0;
  verifyUniformValue4i
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             program,GVar1,0,1,1,in_stack_ffffffffffffffc0);
  GVar1 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"boolUniform");
  glu::CallLogWrapper::glUniform1f(this_00,GVar1,1.0);
  verifyUniformValue1i
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             program,GVar1,GVar2);
  GVar1 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"bool2Uniform");
  glu::CallLogWrapper::glUniform2f(this_00,GVar1,1.0,0.1);
  verifyUniformValue2i
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             program,GVar1,1,y);
  GVar1 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"bool3Uniform");
  glu::CallLogWrapper::glUniform3f(this_00,GVar1,0.0,0.1,-0.1);
  verifyUniformValue3i
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             program,GVar1,0,1,1);
  GVar1 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"bool4Uniform");
  glu::CallLogWrapper::glUniform4f(this_00,GVar1,1.0,0.0,0.1,-0.9);
  verifyUniformValue4i
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             program,GVar1,0,1,1,in_stack_ffffffffffffffc0);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteShader(this_00,shader);
  glu::CallLogWrapper::glDeleteShader(this_00,shader_00);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		static const char* testVertSource =
			"#version 300 es\n"
			"uniform bool boolUniform;\n"
			"uniform bvec2 bool2Uniform;\n"
			"uniform bvec3 bool3Uniform;\n"
			"uniform bvec4 bool4Uniform;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(float(boolUniform) + float(bool2Uniform.x) + float(bool3Uniform.x) + float(bool4Uniform.x));\n"
			"}\n";
		static const char* testFragSource =
			"#version 300 es\n"
			"layout(location = 0) out mediump vec4 fragColor;"
			"void main (void)\n"
			"{\n"
			"	fragColor = vec4(0.0);\n"
			"}\n";

		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);

		glShaderSource(shaderVert, 1, &testVertSource, DE_NULL);
		glShaderSource(shaderFrag, 1, &testFragSource, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);
		expectError(GL_NO_ERROR);

		GLuint program = glCreateProgram();
		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);
		glLinkProgram(program);
		glUseProgram(program);
		expectError(GL_NO_ERROR);

		GLint location;

		// int conversion

		location = glGetUniformLocation(program,"boolUniform");
		glUniform1i(location, 1);
		verifyUniformValue1i(m_testCtx, *this, program, location, 1);

		location = glGetUniformLocation(program,"bool2Uniform");
		glUniform2i(location, 1, 2);
		verifyUniformValue2i(m_testCtx, *this, program, location, 1, 1);

		location = glGetUniformLocation(program,"bool3Uniform");
		glUniform3i(location, 0, 1, 2);
		verifyUniformValue3i(m_testCtx, *this, program, location, 0, 1, 1);

		location = glGetUniformLocation(program,"bool4Uniform");
		glUniform4i(location, 1, 0, 1, -1);
		verifyUniformValue4i(m_testCtx, *this, program, location, 1, 0, 1, 1);

		// float conversion

		location = glGetUniformLocation(program,"boolUniform");
		glUniform1f(location, 1.0f);
		verifyUniformValue1i(m_testCtx, *this, program, location, 1);

		location = glGetUniformLocation(program,"bool2Uniform");
		glUniform2f(location, 1.0f, 0.1f);
		verifyUniformValue2i(m_testCtx, *this, program, location, 1, 1);

		location = glGetUniformLocation(program,"bool3Uniform");
		glUniform3f(location, 0.0f, 0.1f, -0.1f);
		verifyUniformValue3i(m_testCtx, *this, program, location, 0, 1, 1);

		location = glGetUniformLocation(program,"bool4Uniform");
		glUniform4f(location, 1.0f, 0.0f, 0.1f, -0.9f);
		verifyUniformValue4i(m_testCtx, *this, program, location, 1, 0, 1, 1);

		glUseProgram(0);
		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}